

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::WriteLengthDelimited
          (internal *this,uint32_t num,string_view val,string *s)

{
  size_type val_00;
  const_pointer pvVar1;
  string *s_00;
  undefined4 in_register_00000034;
  string *s_local;
  undefined1 auStack_18 [4];
  uint32_t num_local;
  string_view val_local;
  
  _auStack_18 = CONCAT44(in_register_00000034,num);
  s_00 = (string *)val._M_str;
  val_local._M_len = val._M_len;
  WriteVarint((ulong)((int)this * 8 + 2),s_00);
  val_00 = std::basic_string_view<char,_std::char_traits<char>_>::size
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
  WriteVarint(val_00,s_00);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
  std::__cxx11::string::append((char *)s_00,(ulong)pvVar1);
  return;
}

Assistant:

void WriteLengthDelimited(uint32_t num, absl::string_view val, std::string* s) {
  WriteVarint((num << 3) + 2, s);
  WriteVarint(val.size(), s);
  s->append(val.data(), val.size());
}